

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

vector<CNetAddr,_std::allocator<CNetAddr>_> *
LookupIntern(vector<CNetAddr,_std::allocator<CNetAddr>_> *__return_storage_ptr__,string *name,
            uint nMaxSolutions,bool fAllowLookup,DNSLookupFn *dns_lookup_function)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  size_type sVar4;
  CNetAddr *resolved;
  long in_FS_OFFSET;
  bool bVar5;
  initializer_list<CNetAddr> __l;
  CNetAddr addr;
  allocator_type local_79;
  direct_or_indirect local_78;
  uint local_68;
  Network local_60;
  uint32_t uStack_5c;
  direct_or_indirect local_58;
  uint local_48;
  Network local_40;
  uint32_t uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = name->_M_string_length == 0;
  if ((!bVar5) && (pcVar2 = (name->_M_dataplus)._M_p, *pcVar2 != '\0')) {
    sVar4 = 1;
    do {
      bVar5 = name->_M_string_length == sVar4;
      if (bVar5) break;
      pcVar1 = pcVar2 + sVar4;
      sVar4 = sVar4 + 1;
    } while (*pcVar1 != '\0');
  }
  if (bVar5) {
    CNetAddr::CNetAddr((CNetAddr *)&local_58.indirect_contents);
    bVar5 = CNetAddr::SetSpecial((CNetAddr *)&local_58.indirect_contents,name);
    if (bVar5) {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_78,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents);
      local_60 = local_40;
      uStack_5c = uStack_3c;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_78;
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector(__return_storage_ptr__,__l,&local_79)
      ;
      if (0x10 < local_68) {
        free(local_78.indirect_contents.indirect);
        local_78.indirect_contents.indirect = (char *)0x0;
      }
    }
    if (0x10 < local_48) {
      free(local_58.indirect_contents.indirect);
      local_58.indirect_contents.indirect = (char *)0x0;
    }
    if (!bVar5) {
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.direct[0] = fAllowLookup;
      if ((dns_lookup_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar3 = std::__throw_bad_function_call();
          if (0x10 < local_68) {
            free(local_78.indirect_contents.indirect);
            local_78.indirect_contents.indirect = (char *)0x0;
          }
          if (0x10 < local_48) {
            free(local_58.indirect_contents.indirect);
            local_58.indirect_contents.indirect = (char *)0x0;
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar3);
          }
        }
        goto LAB_00d721c2;
      }
      (*dns_lookup_function->_M_invoker)
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)&local_58.indirect_contents,
                 (_Any_data *)dns_lookup_function,name,(bool *)local_78.direct);
      if (local_58.indirect_contents.indirect != (char *)local_58._8_8_) {
        uVar3 = local_58.indirect_contents.indirect;
        do {
          if ((nMaxSolutions != 0) &&
             ((ulong)nMaxSolutions <=
              (ulong)((long)(__return_storage_ptr__->
                            super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->
                            super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 5))) break;
          bVar5 = CNetAddr::IsInternal((CNetAddr *)uVar3);
          if (!bVar5) {
            std::vector<CNetAddr,_std::allocator<CNetAddr>_>::push_back
                      (__return_storage_ptr__,(value_type *)uVar3);
          }
          uVar3 = uVar3 + 0x20;
        } while (uVar3 != local_58._8_8_);
      }
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)&local_58.indirect_contents);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
LAB_00d721c2:
  __stack_chk_fail();
}

Assistant:

static std::vector<CNetAddr> LookupIntern(const std::string& name, unsigned int nMaxSolutions, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    if (!ContainsNoNUL(name)) return {};
    {
        CNetAddr addr;
        // From our perspective, onion addresses are not hostnames but rather
        // direct encodings of CNetAddr much like IPv4 dotted-decimal notation
        // or IPv6 colon-separated hextet notation. Since we can't use
        // getaddrinfo to decode them and it wouldn't make sense to resolve
        // them, we return a network address representing it instead. See
        // CNetAddr::SetSpecial(const std::string&) for more details.
        if (addr.SetSpecial(name)) return {addr};
    }

    std::vector<CNetAddr> addresses;

    for (const CNetAddr& resolved : dns_lookup_function(name, fAllowLookup)) {
        if (nMaxSolutions > 0 && addresses.size() >= nMaxSolutions) {
            break;
        }
        /* Never allow resolving to an internal address. Consider any such result invalid */
        if (!resolved.IsInternal()) {
            addresses.push_back(resolved);
        }
    }

    return addresses;
}